

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O3

iterator __thiscall
ska::detailv3::sherwood_v3_table<$a9d55d12$>::find
          (sherwood_v3_table<_a9d55d12_> *this,
          tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
          *key)

{
  EntryPointer psVar1;
  bool bVar2;
  EntryPointer psVar3;
  ulong uVar4;
  char cVar5;
  size_t local_28;
  
  local_28 = 0;
  slang::detail::
  HashValueImpl<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_1UL>
  ::apply(&local_28,key);
  uVar4 = ((long)(key->
                 super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                 ).
                 super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                 .super__Tuple_impl<2UL,_const_slang::ast::Scope_*>.
                 super__Head_base<2UL,_const_slang::ast::Scope_*,_false>._M_head_impl +
           (local_28 >> 2) + 0x9e3779b9 + local_28 * 0x40 ^ local_28) * -0x61c8864680b583eb >>
          ((this->hash_policy).shift & 0x3fU);
  psVar3 = this->entries;
  if (-1 < psVar3[uVar4].distance_from_desired) {
    cVar5 = '\0';
    psVar3 = psVar3 + uVar4;
    do {
      bVar2 = std::
              __tuple_compare<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_0UL,_3UL>
              ::__eq(key,&(psVar3->field_1).value.first);
      if (bVar2) {
        return (iterator)psVar3;
      }
      cVar5 = cVar5 + '\x01';
      psVar1 = psVar3 + 1;
      psVar3 = psVar3 + 1;
    } while (cVar5 <= psVar1->distance_from_desired);
    psVar3 = this->entries;
  }
  return (iterator)(psVar3 + this->num_slots_minus_one + (long)this->max_lookups);
}

Assistant:

iterator find(const FindKey & key)
    {
        size_t index = hash_policy.index_for_hash(hash_object(key), num_slots_minus_one);
        EntryPointer it = entries + ptrdiff_t(index);
        for (int8_t distance = 0; it->distance_from_desired >= distance; ++distance, ++it)
        {
            if (compares_equal(key, it->value))
                return { it };
        }
        return end();
    }